

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
check_absent_keys<unsigned_long_long>
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<unsigned_long_long> absent_keys)

{
  AssertHelperData *k;
  char *message;
  long lVar1;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_68;
  iterator local_60;
  map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *local_58;
  internal local_50 [8];
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  local_60 = absent_keys._M_array;
  local_58 = &this->values;
  lVar1 = 0;
  while( true ) {
    if (absent_keys._M_len << 3 == lVar1) {
      return;
    }
    k = *(AssertHelperData **)((long)local_60 + lVar1);
    local_38.data_ = k;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::find(&local_58->_M_t,(key_type *)&local_38);
    local_68._M_node = &(this->values)._M_t._M_impl.super__Rb_tree_header._M_header;
    testing::internal::
    CmpHelperEQ<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
              (local_50,"(values.find(to_ikey(k)))","(values.cend())",
               (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)&gtest_ar.message_,&local_68);
    if (local_50[0] == (internal)0x0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
    try_get<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unsigned_long>
              ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                *)this,(unsigned_long)k);
    lVar1 = lVar1 + 8;
  }
  testing::Message::Message((Message *)&gtest_ar.message_);
  if (gtest_ar._0_8_ == 0) {
    message = "";
  }
  else {
    message = *(char **)gtest_ar._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
             ,0x288,message);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }